

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fFboTestUtil.cpp
# Opt level: O3

void __thiscall
deqp::gles31::Functional::FboTestUtil::Texture2DShader::shadeFragments
          (Texture2DShader *this,FragmentPacket *packets,int numPackets,
          FragmentShadingContext *context)

{
  float *pfVar1;
  DataType DVar2;
  pointer pUVar3;
  GenericVec4 *pGVar4;
  int iVar5;
  long lVar6;
  int fragNdx;
  long lVar7;
  ulong uVar8;
  int iVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  Vec4 coord;
  Vec4 colors [4];
  UVec4 uicolor;
  IVec4 icolor;
  Vec2 texCoords [4];
  Vec2 local_138;
  float afStack_130 [30];
  undefined8 local_b8;
  undefined8 uStack_b0;
  undefined8 local_a8;
  undefined8 uStack_a0;
  undefined8 local_98;
  undefined8 uStack_90;
  undefined8 local_88;
  undefined8 uStack_80;
  float local_78;
  float fStack_74;
  float fStack_70;
  float fStack_6c;
  float local_68;
  float fStack_64;
  float fStack_60;
  float fStack_5c;
  Vec2 local_58 [5];
  
  pUVar3 = (this->super_ShaderProgram).m_uniforms.
           super__Vector_base<sglr::UniformSlot,_std::allocator<sglr::UniformSlot>_>._M_impl.
           super__Vector_impl_data._M_start;
  local_a8 = *(undefined8 *)&pUVar3->value;
  uStack_a0 = *(undefined8 *)((long)&pUVar3->value + 8);
  local_b8 = *(undefined8 *)&pUVar3[1].value;
  uStack_b0 = *(undefined8 *)((long)&pUVar3[1].value + 8);
  local_58[2].m_data[0] = 0.0;
  local_58[2].m_data[1] = 0.0;
  local_58[3].m_data[0] = 0.0;
  local_58[3].m_data[1] = 0.0;
  local_58[0].m_data[0] = 0.0;
  local_58[0].m_data[1] = 0.0;
  local_58[1].m_data[0] = 0.0;
  local_58[1].m_data[1] = 0.0;
  afStack_130[0x1a] = 0.0;
  afStack_130[0x1b] = 0.0;
  afStack_130[0x1c] = 0.0;
  afStack_130[0x1d] = 0.0;
  afStack_130[0x16] = 0.0;
  afStack_130[0x17] = 0.0;
  afStack_130[0x18] = 0.0;
  afStack_130[0x19] = 0.0;
  afStack_130[0x12] = 0.0;
  afStack_130[0x13] = 0.0;
  afStack_130[0x14] = 0.0;
  afStack_130[0x15] = 0.0;
  afStack_130[0xe] = 0.0;
  afStack_130[0xf] = 0.0;
  afStack_130[0x10] = 0.0;
  afStack_130[0x11] = 0.0;
  if (0 < numPackets) {
    iVar5 = 0;
    uVar8 = 0;
    do {
      lVar7 = 0;
      do {
        rr::readTriangleVarying<float>((rr *)&local_138,packets + uVar8,context,0,(int)lVar7);
        *&local_58[lVar7].m_data = local_138.m_data;
        lVar7 = lVar7 + 1;
      } while (lVar7 != 4);
      afStack_130[0xe] = 0.0;
      afStack_130[0xf] = 0.0;
      afStack_130[0x10] = 0.0;
      afStack_130[0x11] = 0.0;
      afStack_130[0x12] = 0.0;
      afStack_130[0x13] = 0.0;
      afStack_130[0x14] = 0.0;
      afStack_130[0x15] = 0.0;
      afStack_130[0x16] = 0.0;
      afStack_130[0x17] = 0.0;
      afStack_130[0x18] = 0.0;
      afStack_130[0x19] = 0.0;
      afStack_130[0x1a] = 0.0;
      afStack_130[0x1b] = 0.0;
      afStack_130[0x1c] = 0.0;
      afStack_130[0x1d] = 0.0;
      if (0 < (int)((ulong)((long)(this->m_inputs).
                                  super__Vector_base<deqp::gles31::Functional::FboTestUtil::Texture2DShader::Input,_std::allocator<deqp::gles31::Functional::FboTestUtil::Texture2DShader::Input>_>
                                  ._M_impl.super__Vector_impl_data._M_finish -
                           (long)(this->m_inputs).
                                 super__Vector_base<deqp::gles31::Functional::FboTestUtil::Texture2DShader::Input,_std::allocator<deqp::gles31::Functional::FboTestUtil::Texture2DShader::Input>_>
                                 ._M_impl.super__Vector_impl_data._M_start) >> 2) * 0x38e38e39) {
        lVar7 = 0;
        do {
          iVar9 = (int)lVar7;
          pUVar3 = (this->super_ShaderProgram).m_uniforms.
                   super__Vector_base<sglr::UniformSlot,_std::allocator<sglr::UniformSlot>_>._M_impl
                   .super__Vector_impl_data._M_start;
          local_88 = *(undefined8 *)&pUVar3[iVar9 * 3 + 3].value;
          uStack_80 = *(undefined8 *)((long)&pUVar3[iVar9 * 3 + 3].value + 8);
          local_98 = *(undefined8 *)&pUVar3[iVar9 * 3 + 4].value;
          uStack_90 = *(undefined8 *)((long)&pUVar3[iVar9 * 3 + 4].value + 8);
          afStack_130[10] = 0.0;
          afStack_130[0xb] = 0.0;
          afStack_130[0xc] = 0.0;
          afStack_130[0xd] = 0.0;
          afStack_130[6] = 0.0;
          afStack_130[7] = 0.0;
          afStack_130[8] = 0.0;
          afStack_130[9] = 0.0;
          afStack_130[2] = 0.0;
          afStack_130[3] = 0.0;
          afStack_130[4] = 0.0;
          afStack_130[5] = 0.0;
          local_138.m_data[0] = 0.0;
          local_138.m_data[1] = 0.0;
          afStack_130[0] = 0.0;
          afStack_130[1] = 0.0;
          sglr::rc::Texture2D::sample4
                    (pUVar3[iVar9 * 3 + 2].sampler.tex2D,(Vec4 *)&local_138,local_58,0.0);
          lVar6 = 0;
          do {
            fVar10 = *(float *)((long)local_138.m_data + lVar6 + 4);
            *(float *)((long)afStack_130 + lVar6 + 0x38) =
                 *(float *)((long)local_138.m_data + lVar6) * (float)local_88 + (float)local_98 +
                 *(float *)((long)afStack_130 + lVar6 + 0x38);
            *(float *)((long)afStack_130 + lVar6 + 0x3c) =
                 fVar10 * local_88._4_4_ + local_98._4_4_ +
                 *(float *)((long)afStack_130 + lVar6 + 0x3c);
            *(float *)((long)afStack_130 + lVar6 + 0x40) =
                 *(float *)((long)afStack_130 + lVar6) * (float)uStack_80 + (float)uStack_90 +
                 *(float *)((long)afStack_130 + lVar6 + 0x40);
            *(float *)((long)afStack_130 + lVar6 + 0x44) =
                 *(float *)((long)afStack_130 + lVar6 + 4) * uStack_80._4_4_ + uStack_90._4_4_ +
                 *(float *)((long)afStack_130 + lVar6 + 0x44);
            lVar6 = lVar6 + 0x10;
          } while (lVar6 != 0x40);
          lVar7 = lVar7 + 1;
        } while (lVar7 < (int)((ulong)((long)(this->m_inputs).
                                             super__Vector_base<deqp::gles31::Functional::FboTestUtil::Texture2DShader::Input,_std::allocator<deqp::gles31::Functional::FboTestUtil::Texture2DShader::Input>_>
                                             ._M_impl.super__Vector_impl_data._M_finish -
                                      (long)(this->m_inputs).
                                            super__Vector_base<deqp::gles31::Functional::FboTestUtil::Texture2DShader::Input,_std::allocator<deqp::gles31::Functional::FboTestUtil::Texture2DShader::Input>_>
                                            ._M_impl.super__Vector_impl_data._M_start) >> 2) *
                         0x38e38e39);
      }
      DVar2 = this->m_outputType;
      pGVar4 = context->outputArray;
      lVar7 = 0;
      iVar9 = iVar5;
      do {
        local_138.m_data[1] =
             *(float *)((long)afStack_130 + lVar7 + 0x3c) * local_a8._4_4_ + local_b8._4_4_;
        local_138.m_data[0] =
             *(float *)((long)afStack_130 + lVar7 + 0x38) * (float)local_a8 + (float)local_b8;
        afStack_130[1] =
             *(float *)((long)afStack_130 + lVar7 + 0x44) * uStack_a0._4_4_ + uStack_b0._4_4_;
        afStack_130[0] =
             *(float *)((long)afStack_130 + lVar7 + 0x40) * (float)uStack_a0 + (float)uStack_b0;
        castVectorSaturate<int>((Vec4 *)&local_138);
        castVectorSaturate<unsigned_int>((Vec4 *)&local_138);
        if (DVar2 == TYPE_UINT_VEC4) {
          lVar6 = (long)(context->numFragmentOutputs * iVar9) << 4;
          fVar10 = local_78;
          fVar11 = fStack_74;
          fVar12 = fStack_70;
          fVar13 = fStack_6c;
LAB_004a1246:
          pfVar1 = (float *)((long)&pGVar4->v + lVar6);
          *pfVar1 = fVar10;
          pfVar1[1] = fVar11;
          pfVar1[2] = fVar12;
          pfVar1[3] = fVar13;
        }
        else {
          if (DVar2 == TYPE_INT_VEC4) {
            lVar6 = (long)(context->numFragmentOutputs * iVar9) << 4;
            fVar10 = local_68;
            fVar11 = fStack_64;
            fVar12 = fStack_60;
            fVar13 = fStack_5c;
            goto LAB_004a1246;
          }
          if (DVar2 == TYPE_FLOAT_VEC4) {
            lVar6 = (long)(context->numFragmentOutputs * iVar9) << 4;
            fVar10 = local_138.m_data[0];
            fVar11 = local_138.m_data[1];
            fVar12 = afStack_130[0];
            fVar13 = afStack_130[1];
            goto LAB_004a1246;
          }
        }
        lVar7 = lVar7 + 0x10;
        iVar9 = iVar9 + 1;
      } while (lVar7 != 0x40);
      uVar8 = uVar8 + 1;
      iVar5 = iVar5 + 4;
    } while (uVar8 != (uint)numPackets);
  }
  return;
}

Assistant:

void Texture2DShader::shadeFragments (rr::FragmentPacket* packets, const int numPackets, const rr::FragmentShadingContext& context) const
{
	const tcu::Vec4 outScale (m_uniforms[0].value.f4);
	const tcu::Vec4 outBias	 (m_uniforms[1].value.f4);

	tcu::Vec2 texCoords[4];
	tcu::Vec4 colors[4];

	for (int packetNdx = 0; packetNdx < numPackets; ++packetNdx)
	{
		// setup tex coords
		for (int fragNdx = 0; fragNdx < 4; ++fragNdx)
		{
			const tcu::Vec4	coord = rr::readTriangleVarying<float>(packets[packetNdx], context, 0, fragNdx);
			texCoords[fragNdx] = tcu::Vec2(coord.x(), coord.y());
		}

		// clear result
		for (int fragNdx = 0; fragNdx < 4; ++fragNdx)
			colors[fragNdx] = tcu::Vec4(0.0f);

		// sample each texture
		for (int ndx = 0; ndx < (int)m_inputs.size(); ndx++)
		{
			const sglr::rc::Texture2D*	tex		= m_uniforms[2 + ndx*3].sampler.tex2D;
			const tcu::Vec4				scale	(m_uniforms[2 + ndx*3 + 1].value.f4);
			const tcu::Vec4				bias	(m_uniforms[2 + ndx*3 + 2].value.f4);
			tcu::Vec4 tmpColors[4];

			tex->sample4(tmpColors, texCoords);

			for (int fragNdx = 0; fragNdx < 4; ++fragNdx)
				colors[fragNdx] += tmpColors[fragNdx] * scale + bias;
		}

		// write out
		for (int fragNdx = 0; fragNdx < 4; ++fragNdx)
		{
			const tcu::Vec4		color	= colors[fragNdx] * outScale + outBias;
			const tcu::IVec4	icolor	= castVectorSaturate<deInt32>(color);
			const tcu::UVec4	uicolor	= castVectorSaturate<deUint32>(color);

			if (m_outputType == glu::TYPE_FLOAT_VEC4)			rr::writeFragmentOutput(context, packetNdx, fragNdx, 0, color);
			else if (m_outputType == glu::TYPE_INT_VEC4)		rr::writeFragmentOutput(context, packetNdx, fragNdx, 0, icolor);
			else if (m_outputType == glu::TYPE_UINT_VEC4)		rr::writeFragmentOutput(context, packetNdx, fragNdx, 0, uicolor);
			else
				DE_ASSERT(DE_FALSE);
		}
	}
}